

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_grouping(lysc_ctx *ctx,lysp_node *pnode,lysp_node_grp *grp)

{
  char *pcVar1;
  uint16_t uVar2;
  LY_ERR LVar3;
  int iVar4;
  uint32_t uVar5;
  char *__fmt;
  lysc_ext_instance *ext;
  lysp_node *plVar6;
  void *pvVar7;
  long lVar8;
  char *path;
  lysc_node_container fake_container;
  char *local_110;
  char *local_108;
  anon_union_64_2_4724e097_for_lysp_node_uses_0 local_100;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [80];
  lysc_node *local_58;
  lysc_must *plStack_50;
  lysc_when **local_48;
  lysc_node_action *plStack_40;
  lysc_node_notif *local_38;
  
  local_100.node.next = (lysp_node *)0x0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_100.node.exts = (lysp_ext_instance *)0x0;
  uStack_c0 = 0;
  local_100.node.ref = (char *)0x0;
  local_100.node.iffeatures = (lysp_qname *)0x0;
  local_100.node.dsc = (char *)0x0;
  local_100._8_8_ = (ulong)CONCAT22((grp->field_0).node.flags,0x800) & 0xffffffff001cffff;
  local_100.node.name = (grp->field_0).node.name;
  local_a8._32_8_ = local_a8;
  local_48 = (lysc_when **)0x0;
  plStack_40 = (lysc_node_action *)0x0;
  local_58 = (lysc_node *)0x0;
  plStack_50 = (lysc_must *)0x0;
  local_a8._64_8_ = (lysc_ext_instance *)0x0;
  local_a8._72_8_ = (void *)0x0;
  local_a8._48_8_ = (char *)0x0;
  local_a8._56_8_ = (char *)0x0;
  local_a8._16_8_ = (lysc_node *)0x0;
  local_a8._24_8_ = (lysc_node *)0x0;
  local_38 = (lysc_node_notif *)0x0;
  local_a8._0_2_ = 1;
  local_a8._2_2_ = 0;
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8._8_8_ = ctx->cur_mod;
  local_a8._40_8_ = "fake";
  if (pnode == (lysp_node *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = pnode->flags;
  }
  local_100.node.parent = pnode;
  LVar3 = lys_compile_node_flags(ctx,uVar2,0,(lysc_node *)local_a8);
  if (LVar3 != LY_SUCCESS) goto LAB_00149479;
  if ((grp->field_0).node.parent == (lysp_node *)0x0) {
LAB_001493db:
    local_110 = strdup("/");
    uVar5 = 1;
  }
  else {
    ly_log(ctx->ctx,LY_LLWRN,LY_SUCCESS,"Locally scoped grouping \"%s\" not used.");
    plVar6 = (grp->field_0).node.parent;
    local_110 = (char *)0x0;
    if (plVar6 == (lysp_node *)0x0) goto LAB_001493db;
    do {
      pcVar1 = local_110;
      uVar2 = plVar6->nodetype;
      if (uVar2 == 0x8000) {
        __fmt = "{augment=\'%s\'}";
LAB_00149325:
        iVar4 = asprintf(&local_108,__fmt);
        if (iVar4 == -1) goto LAB_001494eb;
      }
      else {
        if (uVar2 == 0x4000) {
          __fmt = "{grouping=\'%s\'}";
          goto LAB_00149325;
        }
        if (uVar2 == 0x800) {
          __fmt = "{uses=\'%s\'}";
          goto LAB_00149325;
        }
        local_108 = strdup(plVar6->name);
      }
      if (plVar6->parent == (lysp_node *)0x0) {
        uVar5 = asprintf(&local_110,"/%s:%s%s",ctx->cur_mod->name);
      }
      else {
        uVar5 = asprintf(&local_110,"/%s%s",local_108);
      }
      free(pcVar1);
      free(local_108);
      plVar6 = plVar6->parent;
    } while ((plVar6 != (lysp_node *)0x0) && (-1 < (int)uVar5));
    if ((int)uVar5 < 0) {
      free(local_110);
      local_110 = (char *)0x0;
LAB_001494eb:
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_grouping");
      return LY_EMEM;
    }
    if (uVar5 == 0) goto LAB_001493db;
  }
  pcVar1 = local_110;
  strncpy(ctx->path,local_110,0xfed);
  ctx->path_len = uVar5;
  free(pcVar1);
  lysc_update_path(ctx,(lys_module *)0x0,"{grouping}");
  lysc_update_path(ctx,(lys_module *)0x0,(grp->field_0).node.name);
  LVar3 = lys_compile_uses(ctx,(lysp_node_uses *)&local_100.node,(lysc_node *)local_a8,0,
                           (ly_set *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  ctx->path_len = 1;
  ctx->path[1] = '\0';
LAB_00149479:
  lysc_node_container_free(&ctx->free_ctx,(lysc_node_container *)local_a8);
  if ((lysc_ext_instance *)local_a8._64_8_ != (lysc_ext_instance *)0x0) {
    pvVar7 = (void *)0xffffffffffffffff;
    lVar8 = 0;
    do {
      pvVar7 = (void *)((long)pvVar7 + 1);
      if (((lysc_ext_instance *)(local_a8._64_8_ + -0x48))->compiled <= pvVar7) {
        free(&((lysc_ext_instance *)(local_a8._64_8_ + -0x48))->compiled);
        return LVar3;
      }
      ext = (lysc_ext_instance *)((long)(lysc_ext **)local_a8._64_8_ + lVar8);
      lVar8 = lVar8 + 0x48;
      lysc_ext_instance_free(&ctx->free_ctx,ext);
    } while ((lysc_ext_instance *)local_a8._64_8_ != (lysc_ext_instance *)0x0);
  }
  return LVar3;
}

Assistant:

LY_ERR
lys_compile_grouping(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysp_node_grp *grp)
{
    LY_ERR rc = LY_SUCCESS;
    char *path;
    int len;

    /* use grouping status to avoid errors */
    struct lysp_node_uses fake_uses = {
        .parent = pnode,
        .nodetype = LYS_USES,
        .flags = grp->flags & LYS_STATUS_MASK, .next = NULL,
        .name = grp->name,
        .dsc = NULL, .ref = NULL, .when = NULL, .iffeatures = NULL, .exts = NULL,
        .refines = NULL, .augments = NULL
    };
    struct lysc_node_container fake_container = {
        .nodetype = LYS_CONTAINER,
        .flags = 0,
        .module = ctx->cur_mod,
        .parent = NULL, .next = NULL,
        .prev = &fake_container.node,
        .name = "fake",
        .dsc = NULL, .ref = NULL, .exts = NULL, .when = NULL,
        .child = NULL, .musts = NULL, .actions = NULL, .notifs = NULL
    };

    /* compile fake container flags */
    LY_CHECK_GOTO(rc = lys_compile_node_flags(ctx, pnode ? pnode->flags : 0, 0, &fake_container.node), cleanup);

    if (grp->parent) {
        LOGWRN(ctx->ctx, "Locally scoped grouping \"%s\" not used.", grp->name);
    }

    len = lys_compile_grouping_pathlog(ctx, grp->parent, &path);
    if (len < 0) {
        LOGMEM(ctx->ctx);
        return LY_EMEM;
    }
    strncpy(ctx->path, path, LYSC_CTX_BUFSIZE - 1);
    ctx->path_len = (uint32_t)len;
    free(path);

    lysc_update_path(ctx, NULL, "{grouping}");
    lysc_update_path(ctx, NULL, grp->name);
    rc = lys_compile_uses(ctx, &fake_uses, &fake_container.node, 0, NULL);
    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);

    ctx->path_len = 1;
    ctx->path[1] = '\0';

cleanup:
    lysc_node_container_free(&ctx->free_ctx, &fake_container);
    FREE_ARRAY(&ctx->free_ctx, fake_container.exts, lysc_ext_instance_free);
    return rc;
}